

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_matrix.cc
# Opt level: O1

void __thiscall
ipx::NormalMatrix::_Apply(NormalMatrix *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Model *pMVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  Timer timer;
  Timer local_38;
  
  pMVar5 = this->model_;
  uVar2 = pMVar5->num_rows_;
  iVar3 = pMVar5->num_cols_;
  lVar13 = (long)iVar3;
  piVar6 = (pMVar5->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (pMVar5->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (pMVar5->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  Timer::Timer(&local_38);
  pdVar9 = this->W_;
  if (pdVar9 == (double *)0x0) {
    pdVar9 = lhs->_M_data;
    if (lhs->_M_size != 0) {
      memset(pdVar9,0,lhs->_M_size << 3);
    }
    if (0 < iVar3) {
      pdVar10 = rhs->_M_data;
      lVar14 = 0;
      do {
        iVar3 = piVar6[lVar14];
        lVar12 = (long)iVar3;
        iVar4 = piVar6[lVar14 + 1];
        dVar17 = 0.0;
        lVar16 = lVar12;
        if (iVar3 < iVar4) {
          do {
            dVar17 = dVar17 + pdVar10[piVar7[lVar16]] * pdVar8[lVar16];
            lVar16 = lVar16 + 1;
          } while (iVar4 != lVar16);
        }
        if (iVar3 < iVar4) {
          do {
            pdVar9[piVar7[lVar12]] = pdVar8[lVar12] * dVar17 + pdVar9[piVar7[lVar12]];
            lVar12 = lVar12 + 1;
          } while (iVar4 != lVar12);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar13);
    }
  }
  else {
    if (0 < (int)uVar2) {
      pdVar10 = rhs->_M_data;
      pdVar11 = lhs->_M_data;
      uVar15 = 0;
      do {
        pdVar11[uVar15] = pdVar10[uVar15] * pdVar9[lVar13 + uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar2 != uVar15);
    }
    if (0 < iVar3) {
      pdVar10 = rhs->_M_data;
      pdVar11 = lhs->_M_data;
      lVar14 = 0;
      do {
        iVar3 = piVar6[lVar14];
        lVar12 = (long)iVar3;
        iVar4 = piVar6[lVar14 + 1];
        dVar17 = 0.0;
        lVar16 = lVar12;
        if (iVar3 < iVar4) {
          do {
            dVar17 = dVar17 + pdVar10[piVar7[lVar16]] * pdVar8[lVar16];
            lVar16 = lVar16 + 1;
          } while (iVar4 != lVar16);
        }
        if (iVar3 < iVar4) {
          dVar1 = pdVar9[lVar14];
          do {
            pdVar11[piVar7[lVar12]] = pdVar8[lVar12] * dVar17 * dVar1 + pdVar11[piVar7[lVar12]];
            lVar12 = lVar12 + 1;
          } while (iVar4 != lVar12);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar13);
    }
  }
  if (rhs_dot_lhs != (double *)0x0) {
    dVar17 = Dot(rhs,lhs);
    *rhs_dot_lhs = dVar17;
  }
  dVar17 = Timer::Elapsed(&local_38);
  this->time_ = dVar17 + this->time_;
  return;
}

Assistant:

void NormalMatrix::_Apply(const Vector& rhs, Vector& lhs,
                           double* rhs_dot_lhs) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Int* Ap = model_.AI().colptr();
    const Int* Ai = model_.AI().rowidx();
    const double* Ax = model_.AI().values();
    #if MATVECMETHOD == 2
    const Int* Atp = model_.AIt().colptr();
    const Int* Ati = model_.AIt().rowidx();
    const double* Atx = model_.AIt().values();
    #endif
    Timer timer;

    assert(prepared_);
    assert((Int)lhs.size() == m);
    assert((Int)rhs.size() == m);

    if (W_) {
        #if MATVECMETHOD == 1
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            d *= W_[j];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
        #elif MATVECMETHOD == 2
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            work_[j] = d * W_[j];
        }
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int i = 0; i < m; i++) {
            Int begin = Atp[i], end = Atp[i+1]-1; // skip identity entry
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += work_[Ati[p]] * Atx[p];
            lhs[i] += d;
        }
        #elif MATVECMETHOD == 3
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            work_[j] = d * W_[j];
        }
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = work_[j];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
        #else
        #error "invalid MATHVECMETHOD"
        #endif
    } else {
        lhs = 0.0;
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
    }
    if (rhs_dot_lhs)
        *rhs_dot_lhs = Dot(rhs,lhs);
    time_ += timer.Elapsed();
}